

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctcp.c
# Opt level: O3

void nn_ctcp_start_resolving(nn_ctcp *self)

{
  nn_msg *self_00;
  nn_chunkref *self_01;
  nn_epbase *__s;
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  nn_fsm *in_RCX;
  nn_epbase *epbase;
  long lVar5;
  int src;
  nn_msg *dst;
  nn_epbase *pnVar6;
  nn_epbase *pnVar7;
  ulong uVar8;
  nn_fsm *self_02;
  char *unaff_R15;
  int ipv4only;
  size_t ipv4onlylen;
  nn_iovec nStack_a0;
  void *pvStack_90;
  size_t sStack_88;
  void *pvStack_80;
  size_t sStack_78;
  nn_ctcp *pnStack_70;
  char *pcStack_68;
  nn_epbase *pnStack_60;
  nn_epbase *pnStack_58;
  code *pcStack_50;
  int local_3c;
  size_t local_38;
  
  pnVar6 = &self->epbase;
  pcStack_50 = (code *)0x12ca68;
  __s = (nn_epbase *)nn_epbase_getaddr(pnVar6);
  pcStack_50 = (code *)0x12ca78;
  pcVar1 = strchr((char *)__s,0x3b);
  dst = (nn_msg *)0x3a;
  pcStack_50 = (code *)0x12ca88;
  pnVar7 = __s;
  pcVar2 = strrchr((char *)__s,0x3a);
  if (pcVar2 == (char *)0x0) {
    pcStack_50 = (code *)0x12caff;
    nn_ctcp_start_resolving_cold_2();
  }
  else {
    local_38 = 4;
    in_RCX = (nn_fsm *)&stack0xffffffffffffffc4;
    dst = (nn_msg *)0x0;
    pcStack_50 = (code *)0x12cab4;
    pnVar7 = pnVar6;
    nn_epbase_getopt(pnVar6,0,0xe,in_RCX,&stack0xffffffffffffffc8);
    unaff_R15 = pcVar2;
    if (local_38 == 4) {
      pnVar6 = (nn_epbase *)(pcVar1 + 1);
      if (pcVar1 == (char *)0x0) {
        pnVar6 = __s;
      }
      pcStack_50 = (code *)0x12cae4;
      nn_dns_start(&self->dns,(char *)pnVar6,(long)pcVar2 - (long)pnVar6,local_3c,&self->dns_result)
      ;
      self->state = 2;
      return;
    }
  }
  pcStack_50 = nn_stcp_send;
  nn_ctcp_start_resolving_cold_1();
  pcVar2 = (char *)(pnVar7 + -0x21);
  if (pnVar7 == (nn_epbase *)0x0) {
    pcVar2 = (char *)0x0;
  }
  uVar8 = (ulong)*(uint *)(pcVar2 + 0x58);
  pnStack_70 = self;
  pcStack_68 = pcVar1;
  pnStack_60 = pnVar6;
  pnStack_58 = __s;
  pcStack_50 = (code *)unaff_R15;
  if (*(uint *)(pcVar2 + 0x58) == 4) {
    if (*(int *)(pcVar2 + 0x358) == 1) {
      self_00 = (nn_msg *)(pcVar2 + 0x368);
      nn_msg_term(self_00);
      nn_msg_mv(self_00,dst);
      sVar3 = nn_chunkref_size((nn_chunkref *)self_00);
      self_01 = (nn_chunkref *)(pcVar2 + 0x3a8);
      sVar4 = nn_chunkref_size(self_01);
      nn_putll((uint8_t *)(pcVar2 + 0x35c),sVar3 + sVar4);
      nStack_a0.iov_len = 8;
      nStack_a0.iov_base = pcVar2 + 0x35c;
      pvStack_90 = nn_chunkref_data((nn_chunkref *)self_00);
      sStack_88 = nn_chunkref_size((nn_chunkref *)self_00);
      pvStack_80 = nn_chunkref_data(self_01);
      sStack_78 = nn_chunkref_size(self_01);
      nn_usock_send(*(nn_usock **)(pcVar2 + 0x60),&nStack_a0,3);
      pcVar2[0x358] = '\x02';
      pcVar2[0x359] = '\0';
      pcVar2[0x35a] = '\0';
      pcVar2[0x35b] = '\0';
      return;
    }
  }
  else {
    nn_stcp_send_cold_1();
  }
  nn_stcp_send_cold_2();
  lVar5 = uVar8 - 0x210;
  if (uVar8 == 0) {
    lVar5 = 0;
  }
  self_02 = (nn_fsm *)(ulong)*(uint *)(lVar5 + 0x58);
  if (*(uint *)(lVar5 + 0x58) == 4) {
    if (*(int *)(lVar5 + 0x2e8) == 3) {
      nn_msg_mv(dst,(nn_msg *)(lVar5 + 0x2f8));
      nn_msg_init((nn_msg *)(lVar5 + 0x2f8),0);
      *(undefined4 *)(lVar5 + 0x2e8) = 1;
      nn_usock_recv(*(nn_usock **)(lVar5 + 0x60),(void *)(lVar5 + 0x2ec),8,(int *)0x0);
      return;
    }
  }
  else {
    nn_stcp_recv_cold_1();
  }
  src = (int)dst;
  nn_stcp_recv_cold_2();
  nn_fsm_init(self_02,nn_stcp_handler,nn_stcp_shutdown,src,self_02,in_RCX);
  *(undefined4 *)&self_02[1].fn = 1;
  nn_streamhdr_init((nn_streamhdr *)&self_02[1].state,2,self_02);
  self_02[1].shutdown_fn = (nn_fsm_fn)0x0;
  self_02[5].stopped.type = -1;
  self_02[5].stopped.item.next = (nn_queue_item *)0x0;
  nn_pipebase_init((nn_pipebase *)(self_02 + 6),&nn_stcp_pipebase_vfptr,epbase);
  *(undefined4 *)&self_02[8].ctx = 0xffffffff;
  nn_msg_init((nn_msg *)&self_02[8].stopped.src,0);
  *(undefined4 *)&self_02[9].stopped.srcptr = 0xffffffff;
  nn_msg_init((nn_msg *)&self_02[9].stopped.item,0);
  nn_fsm_event_init((nn_fsm_event *)(self_02 + 0xb));
  return;
}

Assistant:

static void nn_ctcp_start_resolving (struct nn_ctcp *self)
{
    const char *addr;
    const char *begin;
    const char *end;
    int ipv4only;
    size_t ipv4onlylen;

    /*  Extract the hostname part from address string. */
    addr = nn_epbase_getaddr (&self->epbase);
    begin = strchr (addr, ';');
    if (!begin)
        begin = addr;
    else
        ++begin;
    end = strrchr (addr, ':');
    nn_assert (end);

    /*  Check whether IPv6 is to be used. */
    ipv4onlylen = sizeof (ipv4only);
    nn_epbase_getopt (&self->epbase, NN_SOL_SOCKET, NN_IPV4ONLY,
        &ipv4only, &ipv4onlylen);
    nn_assert (ipv4onlylen == sizeof (ipv4only));

    /*  TODO: Get the actual value of IPV4ONLY option. */
    nn_dns_start (&self->dns, begin, end - begin, ipv4only, &self->dns_result);

    self->state = NN_CTCP_STATE_RESOLVING;
}